

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void chan_writea0(opl_channel *channel,Bit8u data)

{
  undefined1 uVar1;
  opl_channel *poVar2;
  uint uVar3;
  
  if ((channel->chip->newm == '\0') || (channel->chtype != '\x02')) {
    uVar3 = (uint)data | channel->f_num & 0x300;
    channel->f_num = (Bit16u)uVar3;
    uVar1 = channel->block;
    channel->ksv = ((uVar3 >> ((byte)(9 - channel->chip->nts) & 0x1f) & 1) != 0) + uVar1 * '\x02';
    envelope_update_ksl(channel->slots[0]);
    envelope_update_ksl(channel->slots[1]);
    envelope_update_rate(channel->slots[0]);
    envelope_update_rate(channel->slots[1]);
    if ((channel->chip->newm != '\0') && (channel->chtype == '\x01')) {
      poVar2 = channel->pair;
      poVar2->f_num = channel->f_num;
      poVar2->ksv = channel->ksv;
      envelope_update_ksl(poVar2->slots[0]);
      envelope_update_ksl(channel->pair->slots[1]);
      envelope_update_rate(channel->pair->slots[0]);
      envelope_update_rate(channel->pair->slots[1]);
      return;
    }
  }
  return;
}

Assistant:

void chan_writea0(opl_channel *channel, Bit8u data) {
	if (channel->chip->newm && channel->chtype == ch_4op2) {
		return;
	}
	channel->f_num = (channel->f_num & 0x300) | data;
	channel->ksv = (channel->block << 1) | ((channel->f_num >> (0x09 - channel->chip->nts)) & 0x01);
	envelope_update_ksl(channel->slots[0]);
	envelope_update_ksl(channel->slots[1]);
	envelope_update_rate(channel->slots[0]);
	envelope_update_rate(channel->slots[1]);
	if (channel->chip->newm && channel->chtype == ch_4op) {
		channel->pair->f_num = channel->f_num;
		channel->pair->ksv = channel->ksv;
		envelope_update_ksl(channel->pair->slots[0]);
		envelope_update_ksl(channel->pair->slots[1]);
		envelope_update_rate(channel->pair->slots[0]);
		envelope_update_rate(channel->pair->slots[1]);
	}
}